

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

void __thiscall dgMeshEffect::AddPoint(dgMeshEffect *this,HaF64 *vertex,HaI32 material)

{
  dgBigVector *pdVar1;
  long lVar2;
  dgVertexAtribute attib;
  dgVertexAtribute local_80;
  
  local_80.m_vertex.super_dgTemplateVector<double>.m_x = (double)*vertex;
  local_80.m_vertex.super_dgTemplateVector<double>.m_y = (double)vertex[1];
  local_80.m_vertex.super_dgTemplateVector<double>.m_z = (double)vertex[2];
  local_80.m_vertex.super_dgTemplateVector<double>.m_w = (double)vertex[3];
  if ((((!NAN(local_80.m_vertex.super_dgTemplateVector<double>.m_w)) &&
       ((ulong)ABS(local_80.m_vertex.super_dgTemplateVector<double>.m_w) < 0x7ff0000000000000)) &&
      (!NAN(local_80.m_vertex.super_dgTemplateVector<double>.m_z))) &&
     ((((ulong)ABS(local_80.m_vertex.super_dgTemplateVector<double>.m_z) < 0x7ff0000000000000 &&
       (!NAN(local_80.m_vertex.super_dgTemplateVector<double>.m_y))) &&
      (((ulong)ABS(local_80.m_vertex.super_dgTemplateVector<double>.m_x) < 0x7ff0000000000000 &&
       ((ulong)ABS(local_80.m_vertex.super_dgTemplateVector<double>.m_y) < 0x7ff0000000000000))))))
  {
    AddVertex(this,&local_80.m_vertex);
    pdVar1 = this->m_points;
    lVar2 = (long)*(int *)&(this->super_dgRefCounter).field_0xc;
    local_80.m_vertex.super_dgTemplateVector<double>.m_x =
         pdVar1[lVar2 + -1].super_dgTemplateVector<double>.m_x;
    local_80.m_vertex.super_dgTemplateVector<double>.m_y =
         pdVar1[lVar2 + -1].super_dgTemplateVector<double>.m_y;
    local_80.m_vertex.super_dgTemplateVector<double>.m_z =
         pdVar1[lVar2 + -1].super_dgTemplateVector<double>.m_z;
    local_80.m_vertex.super_dgTemplateVector<double>.m_w =
         pdVar1[lVar2 + -1].super_dgTemplateVector<double>.m_w;
    local_80.m_normal_x = vertex[4];
    local_80.m_normal_y = vertex[5];
    local_80.m_normal_z = vertex[6];
    local_80.m_u0 = vertex[7];
    local_80.m_v0 = vertex[8];
    local_80.m_u1 = vertex[9];
    local_80.m_v1 = vertex[10];
    local_80.m_material = (HaF64)(double)material;
    AddAtribute(this,&local_80);
    return;
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x159,
                "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)");
}

Assistant:

void dgMeshEffect::AddPoint(const hacd::HaF64* vertex, hacd::HaI32 material)
{
	dgVertexAtribute attib;
	AddVertex(dgBigVector (vertex[0], vertex[1], vertex[2], vertex[3]));
	
	attib.m_vertex.m_x = m_points[m_pointCount - 1].m_x;
	attib.m_vertex.m_y = m_points[m_pointCount - 1].m_y;
	attib.m_vertex.m_z = m_points[m_pointCount - 1].m_z;
	attib.m_vertex.m_w = m_points[m_pointCount - 1].m_w;

	attib.m_normal_x = vertex[4];
	attib.m_normal_y = vertex[5];
	attib.m_normal_z = vertex[6];
	attib.m_u0 = vertex[7];
	attib.m_v0 = vertex[8];
	attib.m_u1 = vertex[9];
	attib.m_v1 = vertex[10];
	attib.m_material = material;

	AddAtribute (attib);
}